

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventStream.cpp
# Opt level: O0

void __thiscall binlog::EventStream::readEvent(EventStream *this,uint64_t eventSourceId,Range range)

{
  mapped_type *__lhs;
  mapped_type *pmVar1;
  runtime_error *this_00;
  pointer pvVar2;
  pointer in_RCX;
  pointer in_RDX;
  SegmentedMap<binlog::EventSource> *in_RDI;
  mapped_type **it;
  key_type *in_stack_ffffffffffffff90;
  SegmentedMap<binlog::EventSource> *in_stack_ffffffffffffff98;
  unsigned_long in_stack_ffffffffffffffa8;
  string local_50 [32];
  mapped_type *local_30;
  mapped_type **local_28;
  pointer local_10;
  pointer local_8;
  
  local_10 = in_RDX;
  local_8 = in_RCX;
  __lhs = detail::SegmentedMap<binlog::EventSource>::find
                    (in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  local_28 = &local_30;
  local_30 = __lhs;
  pmVar1 = detail::SegmentedMap<binlog::EventSource>::end(in_RDI);
  if (__lhs == pmVar1) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::to_string(in_stack_ffffffffffffffa8);
    std::operator+((char *)__lhs,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RDI);
    std::runtime_error::runtime_error(this_00,local_50);
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  in_RDI[3]._offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = &(*local_28)->id;
  pvVar2 = (pointer)Range::read<unsigned_long>((Range *)in_RDI);
  in_RDI[3]._segments.
  super__Vector_base<std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>,_std::allocator<std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = pvVar2;
  in_RDI[3]._segments.
  super__Vector_base<std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>,_std::allocator<std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = local_10;
  in_RDI[3]._segments.
  super__Vector_base<std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>,_std::allocator<std::vector<binlog::EventSource,_std::allocator<binlog::EventSource>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = local_8;
  return;
}

Assistant:

void EventStream::readEvent(std::uint64_t eventSourceId, Range range)
{
  auto&& it = _eventSources.find(eventSourceId);
  if (it == _eventSources.end())
  {
    throw std::runtime_error("Event has invalid source id: " + std::to_string(eventSourceId));
  }

  _event.source = it;
  _event.clockValue = range.read<std::uint64_t>();
  _event.arguments = range;
}